

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns_core.c
# Opt level: O1

void FeatureParameterExtraction(NoiseSuppressionC *self,int flag)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  if (flag != 1) {
    if (flag != 0) {
      return;
    }
    fVar15 = self->featureData[3];
    if ((0.0 <= fVar15) &&
       (fVar16 = (self->featureExtractionParams).binSizeLrt, fVar15 < fVar16 * 1000.0)) {
      self->histLrt[(int)(fVar15 / fVar16)] = self->histLrt[(int)(fVar15 / fVar16)] + 1;
    }
    fVar15 = self->featureData[0];
    if ((0.0 <= fVar15) &&
       (fVar16 = (self->featureExtractionParams).binSizeSpecFlat, fVar15 < fVar16 * 1000.0)) {
      self->histSpecFlat[(int)(fVar15 / fVar16)] = self->histSpecFlat[(int)(fVar15 / fVar16)] + 1;
    }
    fVar15 = self->featureData[4];
    if (fVar15 < 0.0) {
      return;
    }
    fVar16 = (self->featureExtractionParams).binSizeSpecDiff;
    if (fVar16 * 1000.0 <= fVar15) {
      return;
    }
    self->histSpecDiff[(int)(fVar15 / fVar16)] = self->histSpecDiff[(int)(fVar15 / fVar16)] + 1;
    return;
  }
  lVar5 = 0;
  fVar16 = 0.0;
  fVar15 = 0.0;
  fVar17 = 0.0;
  iVar7 = 0;
  do {
    fVar19 = ((float)(int)lVar5 + 0.5) * (self->featureExtractionParams).binSizeLrt;
    if (fVar19 <= (self->featureExtractionParams).rangeAvgHistLrt) {
      fVar17 = fVar17 + (float)self->histLrt[lVar5] * fVar19;
      iVar7 = iVar7 + self->histLrt[lVar5];
    }
    fVar21 = (float)self->histLrt[lVar5] * fVar19;
    fVar15 = fVar15 + fVar19 * fVar21;
    fVar16 = fVar16 + fVar21;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 1000);
  if (0 < iVar7) {
    fVar17 = fVar17 / (float)iVar7;
  }
  fVar16 = fVar15 / (float)self->modelUpdatePars[1] -
           (fVar16 / (float)self->modelUpdatePars[1]) * fVar17;
  fVar15 = (self->featureExtractionParams).thresFluctLrt;
  if (fVar16 < fVar15) {
    fVar17 = (self->featureExtractionParams).maxLrt;
  }
  else {
    fVar17 = fVar17 * (self->featureExtractionParams).factor1ModelPars;
    self->priorModelPars[0] = fVar17;
    fVar19 = (self->featureExtractionParams).minLrt;
    if (fVar17 < fVar19) {
      self->priorModelPars[0] = fVar19;
    }
    fVar17 = (self->featureExtractionParams).maxLrt;
    if (self->priorModelPars[0] <= fVar17) goto LAB_00184e5f;
  }
  self->priorModelPars[0] = fVar17;
LAB_00184e5f:
  lVar5 = 0;
  iVar12 = 0;
  iVar13 = 0;
  iVar8 = 0;
  fVar17 = 0.0;
  fVar19 = 0.0;
  iVar7 = 0;
  do {
    fVar22 = ((float)(int)lVar5 + 0.5) * (self->featureExtractionParams).binSizeSpecFlat;
    iVar10 = self->histSpecFlat[lVar5];
    fVar21 = fVar22;
    fVar18 = fVar17;
    iVar14 = iVar13;
    iVar9 = iVar8;
    iVar1 = iVar10;
    iVar2 = iVar10;
    if ((iVar10 <= iVar8) &&
       (fVar21 = fVar17, fVar18 = fVar19, iVar14 = iVar12, iVar9 = iVar7, iVar1 = iVar13,
       iVar2 = iVar8, iVar7 < iVar10)) {
      fVar18 = fVar22;
      iVar14 = iVar10;
      iVar9 = iVar10;
    }
    iVar8 = iVar2;
    iVar13 = iVar1;
    iVar12 = iVar14;
    lVar5 = lVar5 + 1;
    fVar17 = fVar21;
    fVar19 = fVar18;
    iVar7 = iVar9;
  } while (lVar5 != 1000);
  lVar5 = 0;
  iVar8 = 0;
  iVar7 = 0;
  iVar10 = 0;
  iVar14 = 0;
  fVar17 = 0.0;
  fVar19 = 0.0;
  do {
    fVar23 = ((float)(int)lVar5 + 0.5) * (self->featureExtractionParams).binSizeSpecDiff;
    iVar9 = self->histSpecDiff[lVar5];
    fVar22 = fVar19;
    fVar20 = fVar23;
    iVar1 = iVar7;
    iVar2 = iVar14;
    iVar3 = iVar9;
    iVar4 = iVar9;
    if ((iVar9 <= iVar14) &&
       (fVar22 = fVar17, fVar20 = fVar19, iVar1 = iVar8, iVar2 = iVar10, iVar3 = iVar7,
       iVar4 = iVar14, iVar10 < iVar9)) {
      fVar22 = fVar23;
      iVar1 = iVar9;
      iVar2 = iVar9;
    }
    iVar14 = iVar4;
    iVar7 = iVar3;
    iVar10 = iVar2;
    iVar8 = iVar1;
    lVar5 = lVar5 + 1;
    fVar17 = fVar22;
    fVar19 = fVar20;
  } while (lVar5 != 1000);
  if ((ABS(fVar18 - fVar21) < (self->featureExtractionParams).limitPeakSpacingSpecFlat) &&
     ((float)iVar13 * (self->featureExtractionParams).limitPeakWeightsSpecFlat < (float)iVar12)) {
    iVar13 = iVar13 + iVar12;
    fVar21 = (fVar21 + fVar18) * 0.5;
  }
  if ((iVar13 < (self->featureExtractionParams).thresWeightSpecFlat) ||
     (fVar21 < (self->featureExtractionParams).thresPosSpecFlat)) {
    bVar6 = false;
    bVar11 = 0;
  }
  else {
    bVar11 = 1;
    bVar6 = true;
  }
  if (bVar6) {
    fVar21 = fVar21 * (self->featureExtractionParams).factor2ModelPars;
    self->priorModelPars[1] = fVar21;
    fVar17 = (self->featureExtractionParams).minSpecFlat;
    if (fVar21 < fVar17) {
      self->priorModelPars[1] = fVar17;
    }
    fVar17 = (self->featureExtractionParams).maxSpecFlat;
    if (fVar17 < self->priorModelPars[1]) {
      self->priorModelPars[1] = fVar17;
    }
  }
  if ((ABS(fVar22 - fVar20) < (self->featureExtractionParams).limitPeakSpacingSpecDiff) &&
     ((float)iVar7 * (self->featureExtractionParams).limitPeakWeightsSpecDiff < (float)iVar8)) {
    iVar7 = iVar7 + iVar8;
    fVar20 = (fVar20 + fVar22) * 0.5;
  }
  fVar20 = fVar20 * (self->featureExtractionParams).factor1ModelPars;
  self->priorModelPars[3] = fVar20;
  fVar17 = (self->featureExtractionParams).minSpecDiff;
  if (fVar20 < fVar17) {
    self->priorModelPars[3] = fVar17;
  }
  iVar8 = (self->featureExtractionParams).thresWeightSpecDiff;
  fVar17 = (self->featureExtractionParams).maxSpecDiff;
  if (fVar17 < self->priorModelPars[3]) {
    self->priorModelPars[3] = fVar17;
  }
  bVar6 = fVar15 <= fVar16 && iVar8 <= iVar7;
  fVar15 = (float)(byte)(bVar11 + bVar6 + 1);
  self->priorModelPars[4] = 1.0 / fVar15;
  self->priorModelPars[5] = (float)bVar11 / fVar15;
  self->priorModelPars[6] = (float)bVar6 / fVar15;
  if (self->modelUpdatePars[0] < 1) {
    return;
  }
  memset(self->histLrt,0,12000);
  return;
}

Assistant:

static void FeatureParameterExtraction(NoiseSuppressionC* self, int flag) {
  int i, useFeatureSpecFlat, useFeatureSpecDiff, numHistLrt;
  int maxPeak1, maxPeak2;
  int weightPeak1SpecFlat, weightPeak2SpecFlat, weightPeak1SpecDiff,
      weightPeak2SpecDiff;

  float binMid, featureSum;
  float posPeak1SpecFlat, posPeak2SpecFlat, posPeak1SpecDiff, posPeak2SpecDiff;
  float fluctLrt, avgHistLrt, avgSquareHistLrt, avgHistLrtCompl;

  // 3 features: LRT, flatness, difference.
  // lrt_feature = self->featureData[3];
  // flat_feature = self->featureData[0];
  // diff_feature = self->featureData[4];

  // Update histograms.
  if (flag == 0) {
    // LRT
    if ((self->featureData[3] <
         HIST_PAR_EST * self->featureExtractionParams.binSizeLrt) &&
        (self->featureData[3] >= 0.0)) {
      i = (int)(self->featureData[3] /
                self->featureExtractionParams.binSizeLrt);
      self->histLrt[i]++;
    }
    // Spectral flatness.
    if ((self->featureData[0] <
         HIST_PAR_EST * self->featureExtractionParams.binSizeSpecFlat) &&
        (self->featureData[0] >= 0.0)) {
      i = (int)(self->featureData[0] /
                self->featureExtractionParams.binSizeSpecFlat);
      self->histSpecFlat[i]++;
    }
    // Spectral difference.
    if ((self->featureData[4] <
         HIST_PAR_EST * self->featureExtractionParams.binSizeSpecDiff) &&
        (self->featureData[4] >= 0.0)) {
      i = (int)(self->featureData[4] /
                self->featureExtractionParams.binSizeSpecDiff);
      self->histSpecDiff[i]++;
    }
  }

  // Extract parameters for speech/noise probability.
  if (flag == 1) {
    // LRT feature: compute the average over
    // self->featureExtractionParams.rangeAvgHistLrt.
    avgHistLrt = 0.0;
    avgHistLrtCompl = 0.0;
    avgSquareHistLrt = 0.0;
    numHistLrt = 0;
    for (i = 0; i < HIST_PAR_EST; i++) {
      binMid = ((float)i + 0.5f) * self->featureExtractionParams.binSizeLrt;
      if (binMid <= self->featureExtractionParams.rangeAvgHistLrt) {
        avgHistLrt += self->histLrt[i] * binMid;
        numHistLrt += self->histLrt[i];
      }
      avgSquareHistLrt += self->histLrt[i] * binMid * binMid;
      avgHistLrtCompl += self->histLrt[i] * binMid;
    }
    if (numHistLrt > 0) {
      avgHistLrt = avgHistLrt / ((float)numHistLrt);
    }
    avgHistLrtCompl = avgHistLrtCompl / ((float)self->modelUpdatePars[1]);
    avgSquareHistLrt = avgSquareHistLrt / ((float)self->modelUpdatePars[1]);
    fluctLrt = avgSquareHistLrt - avgHistLrt * avgHistLrtCompl;
    // Get threshold for LRT feature.
    if (fluctLrt < self->featureExtractionParams.thresFluctLrt) {
      // Very low fluctuation, so likely noise.
      self->priorModelPars[0] = self->featureExtractionParams.maxLrt;
    } else {
      self->priorModelPars[0] =
          self->featureExtractionParams.factor1ModelPars * avgHistLrt;
      // Check if value is within min/max range.
      if (self->priorModelPars[0] < self->featureExtractionParams.minLrt) {
        self->priorModelPars[0] = self->featureExtractionParams.minLrt;
      }
      if (self->priorModelPars[0] > self->featureExtractionParams.maxLrt) {
        self->priorModelPars[0] = self->featureExtractionParams.maxLrt;
      }
    }
    // Done with LRT feature.

    // For spectral flatness and spectral difference: compute the main peaks of
    // histogram.
    maxPeak1 = 0;
    maxPeak2 = 0;
    posPeak1SpecFlat = 0.0;
    posPeak2SpecFlat = 0.0;
    weightPeak1SpecFlat = 0;
    weightPeak2SpecFlat = 0;

    // Peaks for flatness.
    for (i = 0; i < HIST_PAR_EST; i++) {
      binMid =
          (i + 0.5f) * self->featureExtractionParams.binSizeSpecFlat;
      if (self->histSpecFlat[i] > maxPeak1) {
        // Found new "first" peak.
        maxPeak2 = maxPeak1;
        weightPeak2SpecFlat = weightPeak1SpecFlat;
        posPeak2SpecFlat = posPeak1SpecFlat;

        maxPeak1 = self->histSpecFlat[i];
        weightPeak1SpecFlat = self->histSpecFlat[i];
        posPeak1SpecFlat = binMid;
      } else if (self->histSpecFlat[i] > maxPeak2) {
        // Found new "second" peak.
        maxPeak2 = self->histSpecFlat[i];
        weightPeak2SpecFlat = self->histSpecFlat[i];
        posPeak2SpecFlat = binMid;
      }
    }

    // Compute two peaks for spectral difference.
    maxPeak1 = 0;
    maxPeak2 = 0;
    posPeak1SpecDiff = 0.0;
    posPeak2SpecDiff = 0.0;
    weightPeak1SpecDiff = 0;
    weightPeak2SpecDiff = 0;
    // Peaks for spectral difference.
    for (i = 0; i < HIST_PAR_EST; i++) {
      binMid =
          ((float)i + 0.5f) * self->featureExtractionParams.binSizeSpecDiff;
      if (self->histSpecDiff[i] > maxPeak1) {
        // Found new "first" peak.
        maxPeak2 = maxPeak1;
        weightPeak2SpecDiff = weightPeak1SpecDiff;
        posPeak2SpecDiff = posPeak1SpecDiff;

        maxPeak1 = self->histSpecDiff[i];
        weightPeak1SpecDiff = self->histSpecDiff[i];
        posPeak1SpecDiff = binMid;
      } else if (self->histSpecDiff[i] > maxPeak2) {
        // Found new "second" peak.
        maxPeak2 = self->histSpecDiff[i];
        weightPeak2SpecDiff = self->histSpecDiff[i];
        posPeak2SpecDiff = binMid;
      }
    }

    // For spectrum flatness feature.
    useFeatureSpecFlat = 1;
    // Merge the two peaks if they are close.
    if ((fabs(posPeak2SpecFlat - posPeak1SpecFlat) <
         self->featureExtractionParams.limitPeakSpacingSpecFlat) &&
        (weightPeak2SpecFlat >
         self->featureExtractionParams.limitPeakWeightsSpecFlat *
             weightPeak1SpecFlat)) {
      weightPeak1SpecFlat += weightPeak2SpecFlat;
      posPeak1SpecFlat = 0.5f * (posPeak1SpecFlat + posPeak2SpecFlat);
    }
    // Reject if weight of peaks is not large enough, or peak value too small.
    if (weightPeak1SpecFlat <
            self->featureExtractionParams.thresWeightSpecFlat ||
        posPeak1SpecFlat < self->featureExtractionParams.thresPosSpecFlat) {
      useFeatureSpecFlat = 0;
    }
    // If selected, get the threshold.
    if (useFeatureSpecFlat == 1) {
      // Compute the threshold.
      self->priorModelPars[1] =
          self->featureExtractionParams.factor2ModelPars * posPeak1SpecFlat;
      // Check if value is within min/max range.
      if (self->priorModelPars[1] < self->featureExtractionParams.minSpecFlat) {
        self->priorModelPars[1] = self->featureExtractionParams.minSpecFlat;
      }
      if (self->priorModelPars[1] > self->featureExtractionParams.maxSpecFlat) {
        self->priorModelPars[1] = self->featureExtractionParams.maxSpecFlat;
      }
    }
    // Done with flatness feature.

    // For template feature.
    useFeatureSpecDiff = 1;
    // Merge the two peaks if they are close.
    if ((fabs(posPeak2SpecDiff - posPeak1SpecDiff) <
         self->featureExtractionParams.limitPeakSpacingSpecDiff) &&
        (weightPeak2SpecDiff >
         self->featureExtractionParams.limitPeakWeightsSpecDiff *
             weightPeak1SpecDiff)) {
      weightPeak1SpecDiff += weightPeak2SpecDiff;
      posPeak1SpecDiff = 0.5f * (posPeak1SpecDiff + posPeak2SpecDiff);
    }
    // Get the threshold value.
    self->priorModelPars[3] =
        self->featureExtractionParams.factor1ModelPars * posPeak1SpecDiff;
    // Reject if weight of peaks is not large enough.
    if (weightPeak1SpecDiff <
        self->featureExtractionParams.thresWeightSpecDiff) {
      useFeatureSpecDiff = 0;
    }
    // Check if value is within min/max range.
    if (self->priorModelPars[3] < self->featureExtractionParams.minSpecDiff) {
      self->priorModelPars[3] = self->featureExtractionParams.minSpecDiff;
    }
    if (self->priorModelPars[3] > self->featureExtractionParams.maxSpecDiff) {
      self->priorModelPars[3] = self->featureExtractionParams.maxSpecDiff;
    }
    // Done with spectral difference feature.

    // Don't use template feature if fluctuation of LRT feature is very low:
    // most likely just noise state.
    if (fluctLrt < self->featureExtractionParams.thresFluctLrt) {
      useFeatureSpecDiff = 0;
    }

    // Select the weights between the features.
    // self->priorModelPars[4] is weight for LRT: always selected.
    // self->priorModelPars[5] is weight for spectral flatness.
    // self->priorModelPars[6] is weight for spectral difference.
    featureSum = (float)(1 + useFeatureSpecFlat + useFeatureSpecDiff);
    self->priorModelPars[4] = 1.f / featureSum;
    self->priorModelPars[5] = ((float)useFeatureSpecFlat) / featureSum;
    self->priorModelPars[6] = ((float)useFeatureSpecDiff) / featureSum;

    // Set hists to zero for next update.
    if (self->modelUpdatePars[0] >= 1) {
      for (i = 0; i < HIST_PAR_EST; i++) {
        self->histLrt[i] = 0;
        self->histSpecFlat[i] = 0;
        self->histSpecDiff[i] = 0;
      }
    }
  }  // End of flag == 1.
}